

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCustomAttributes.cpp
# Opt level: O0

void testCustomAttributes(string *tempDir)

{
  ostream *poVar1;
  exception *e;
  string filename;
  Array2D<float> pf;
  int H;
  int W;
  int in_stack_000002a0;
  int in_stack_000002a4;
  char *in_stack_000002a8;
  Array2D<float> *in_stack_000002b0;
  Array2D<float> *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  Array2D<float> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing custom attributes");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imf_2_5::Array2D<float>::Array2D
            (in_stack_ffffffffffffff90,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
             ,(long)in_stack_ffffffffffffff80);
  anon_unknown.dwarf_ae25f::fillPixels
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
  std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::__cxx11::string::c_str();
  anon_unknown.dwarf_ae25f::writeReadCustomAttr
            (in_stack_000002b0,in_stack_000002a8,in_stack_000002a4,in_stack_000002a0);
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  Imf_2_5::Array2D<float>::~Array2D(in_stack_ffffffffffffff80);
  return;
}

Assistant:

void
testCustomAttributes (const std::string &tempDir)
{
    try
    {
	cout << "Testing custom attributes" << endl;

	const int W = 217;
	const int H = 197;

	Array2D<float> pf (H, W);
	fillPixels (pf, W, H);

	std::string filename = tempDir + "imf_test_custom_attr.exr";

	writeReadCustomAttr (pf, filename.c_str(), W, H);

	cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
	cerr << "ERROR -- caught exception: " << e.what() << endl;
	assert (false);
    }
}